

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

vector<wasm::Type,_std::allocator<wasm::Type>_> * __thiscall
wasm::HeapType::getTypeChildren
          (vector<wasm::Type,_std::allocator<wasm::Type>_> *__return_storage_ptr__,HeapType *this)

{
  ulong uVar1;
  Type *pTVar2;
  iterator iVar3;
  size_t sVar4;
  Type *pTVar5;
  size_t sVar6;
  Field *field;
  long lVar7;
  bool bVar8;
  initializer_list<wasm::Type> __l;
  Signature local_60;
  Type local_50;
  Type tuple;
  Type t;
  Iterator __begin4;
  
  uVar1 = this->id;
  if (uVar1 < 0x7d) {
switchD_00cadea8_caseD_0:
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    switch(*(undefined4 *)(uVar1 + 0x30)) {
    case 0:
    case 4:
      goto switchD_00cadea8_caseD_0;
    case 1:
      (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_60 = getSignature(this);
      lVar7 = 0;
      do {
        local_50.id = *(uintptr_t *)((long)&local_60.params.id + lVar7);
        t.id = (uintptr_t)&local_50;
        sVar4 = wasm::Type::size((Type *)t.id);
        if (sVar4 != 0) {
          sVar6 = 1;
          do {
            pTVar5 = wasm::Type::Iterator::operator*((Iterator *)&t);
            tuple.id = pTVar5->id;
            iVar3._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<wasm::Type,std::allocator<wasm::Type>>::
              _M_realloc_insert<wasm::Type_const&>
                        ((vector<wasm::Type,std::allocator<wasm::Type>> *)__return_storage_ptr__,
                         iVar3,&tuple);
            }
            else {
              (iVar3._M_current)->id = tuple.id;
              (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
              _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
            bVar8 = sVar6 != sVar4;
            sVar6 = sVar6 + 1;
          } while (bVar8);
        }
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x10);
      break;
    case 2:
      (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (*(int *)(uVar1 + 0x30) != 2) {
        __assert_fail("isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                      ,0x39f,"const Struct &wasm::HeapType::getStruct() const");
      }
      pTVar2 = *(Type **)(uVar1 + 0x40);
      for (pTVar5 = *(Type **)(uVar1 + 0x38); pTVar5 != pTVar2; pTVar5 = pTVar5 + 2) {
        iVar3._M_current =
             (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                    ((vector<wasm::Type,std::allocator<wasm::Type>> *)__return_storage_ptr__,iVar3,
                     pTVar5);
        }
        else {
          (iVar3._M_current)->id = pTVar5->id;
          (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
      }
      break;
    case 3:
      local_60.results.id = local_60.params.id;
      local_60.params.id = *(uintptr_t *)(uVar1 + 0x38);
      __l._M_len = 1;
      __l._M_array = &local_60.params;
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                (__return_storage_ptr__,__l,(allocator_type *)&t);
      break;
    default:
      handle_unreachable("unexpected kind",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                         ,0x497);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Type> HeapType::getTypeChildren() const {
  switch (getKind()) {
    case HeapTypeKind::Basic:
      return {};
    case HeapTypeKind::Func: {
      std::vector<Type> children;
      auto sig = getSignature();
      for (auto tuple : {sig.params, sig.results}) {
        for (auto t : tuple) {
          children.push_back(t);
        }
      }
      return children;
    }
    case HeapTypeKind::Struct: {
      std::vector<Type> children;
      for (auto& field : getStruct().fields) {
        children.push_back(field.type);
      }
      return children;
    }
    case HeapTypeKind::Array:
      return {getArray().element.type};
    case HeapTypeKind::Cont:
      return {};
  }
  WASM_UNREACHABLE("unexpected kind");
}